

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O1

void __thiscall Fl_Tree::load(Fl_Tree *this,Fl_Preferences *prefs)

{
  char *__s;
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *__s_00;
  ulong uVar5;
  char *__format;
  int iVar6;
  uint uVar7;
  Fl_Preferences prefsChild;
  Fl_Preferences local_58;
  long local_40;
  long local_38;
  
  __s = prefs->node->path_;
  sVar3 = strlen(__s);
  iVar1 = strcmp(__s,".");
  iVar2 = Fl_Preferences::groups(prefs);
  if (0 < iVar2) {
    iVar6 = 0;
    do {
      Fl_Preferences::Fl_Preferences(&local_58,prefs,iVar6);
      add(this,(local_58.node)->path_ + 2,(Fl_Tree_Item *)0x0);
      load(this,&local_58);
      Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_58);
      iVar6 = iVar6 + 1;
    } while (iVar2 != iVar6);
  }
  iVar2 = Fl_Preferences::entries(prefs);
  if (0 < iVar2) {
    local_40 = (long)(int)sVar3 + 0x2d;
    local_38 = (long)(int)sVar3 + 5;
    iVar6 = 0;
    do {
      pcVar4 = Fl_Preferences::entry(prefs,iVar6);
      pcVar4 = strdup(pcVar4);
      sVar3 = strlen(pcVar4);
      if (0 < (int)(uint)sVar3) {
        uVar5 = 0;
        do {
          if (pcVar4[uVar5] == '/') {
            pcVar4[uVar5] = '\\';
          }
          uVar5 = uVar5 + 1;
        } while (((uint)sVar3 & 0x7fffffff) != uVar5);
      }
      Fl_Preferences::get(prefs,pcVar4,(char **)&local_58,"");
      sVar3 = strlen((char *)local_58._vptr_Fl_Preferences);
      uVar7 = (uint)sVar3;
      if (0 < (int)uVar7) {
        uVar5 = 0;
        do {
          if (*(char *)((long)local_58._vptr_Fl_Preferences + uVar5) == '/') {
            *(char *)((long)local_58._vptr_Fl_Preferences + uVar5) = '\\';
          }
          uVar5 = uVar5 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar5);
      }
      sVar3 = strlen(pcVar4);
      if ((int)uVar7 < 0x28) {
        __s_00 = (char *)malloc((int)uVar7 + local_38 + sVar3);
        __format = "%s/%s = %s";
      }
      else {
        __s_00 = (char *)malloc(sVar3 + local_40);
        __format = "%s/%s = %.40s...";
      }
      sprintf(__s_00,__format,__s + (2 - (ulong)(iVar1 == 0)),pcVar4,local_58._vptr_Fl_Preferences);
      add(this,__s_00 + (*__s_00 == '/'),(Fl_Tree_Item *)0x0);
      free(__s_00);
      free(local_58._vptr_Fl_Preferences);
      free(pcVar4);
      iVar6 = iVar6 + 1;
    } while (iVar6 != iVar2);
  }
  return;
}

Assistant:

void Fl_Tree::load(Fl_Preferences &prefs) {
  int i, j, n, pn = (int) strlen(prefs.path());
  char *p;
  const char *path = prefs.path();
  if (strcmp(path, ".")==0)
    path += 1; // root path is empty
  else
    path += 2; // child path starts with "./"
  n = prefs.groups();
  for (i=0; i<n; i++) {
    Fl_Preferences prefsChild(prefs, i);
    add(prefsChild.path()+2); // children always start with "./"
    load(prefsChild);
  }
  n = prefs.entries();
  for (i=0; i<n; i++) {
    // We must remove all fwd slashes in the key and value strings. Replace with backslash.
    char *key = strdup(prefs.entry(i));
    int kn = (int) strlen(key);
    for (j=0; j<kn; j++) {
      if (key[j]=='/') key[j]='\\'; 
    }
    char *val;  prefs.get(key, val, "");
    int vn = (int) strlen(val);
    for (j=0; j<vn; j++) {
      if (val[j]=='/') val[j]='\\'; 
    }
    if (vn<40) {
      size_t sze = pn + strlen(key) + vn;
      p = (char*)malloc(sze+5);
      sprintf(p, "%s/%s = %s", path, key, val);
    } else {
      size_t sze = pn + strlen(key) + 40;
      p = (char*)malloc(sze+5);
      sprintf(p, "%s/%s = %.40s...", path, key, val);
    }
    add(p[0]=='/'?p+1:p);
    free(p);
    free(val);
    free(key);
  }
}